

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

int __thiscall DetectorSS::Estimate(DetectorSS *this,int bucket,uchar *bmp)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bitmap in_RDX;
  int in_ESI;
  int *in_RDI;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int i;
  int pos;
  int factor;
  double m;
  int base;
  int tmpoff;
  int z;
  int offs;
  int local_3c;
  int local_38;
  int local_34;
  ulong local_30;
  int local_28;
  undefined1 extraout_var [56];
  
  iVar2 = in_ESI * *(int *)(*(long *)(in_RDI + 6) + (long)in_RDI[1] * 4);
  local_34 = 1;
  local_28 = 0;
  while ((local_28 < in_RDI[1] + -1 &&
         (iVar4 = iVar2 + *(int *)(*(long *)(in_RDI + 6) + (long)local_28 * 4),
         iVar4 = countzerobits(in_RDX,iVar4,iVar4 + *in_RDI), in_RDI[3] < *in_RDI - iVar4))) {
    local_34 = local_34 << 1;
    local_28 = local_28 + 1;
  }
  local_30 = 0;
  local_38 = local_28 + -1;
  for (local_3c = local_28; local_3c < in_RDI[1] + -1; local_3c = local_3c + 1) {
    iVar4 = iVar2 + *(int *)(*(long *)(in_RDI + 6) + (long)local_3c * 4);
    iVar3 = countzerobits(in_RDX,iVar4,iVar4 + *in_RDI);
    iVar4 = *in_RDI;
    dVar5 = log((double)*in_RDI);
    dVar6 = log((double)iVar3);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (double)iVar4;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_30;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5 - dVar6;
    auVar7 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
    local_30 = auVar7._0_8_;
    if ((iVar3 == 0) || (in_RDI[3] < *in_RDI - iVar3)) {
      local_38 = local_3c;
      local_30 = 0;
    }
  }
  iVar2 = iVar2 + *(int *)(*(long *)(in_RDI + 6) + (long)(in_RDI[1] + -1) * 4);
  iVar2 = countzerobits(in_RDX,iVar2,iVar2 + in_RDI[2]);
  if (iVar2 == 0) {
    iVar2 = in_RDI[2];
    auVar10._0_8_ = log((double)in_RDI[2]);
    auVar10._8_56_ = extraout_var;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (double)iVar2;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_30;
    auVar7 = vfmadd213sd_fma(auVar10._0_16_,auVar12,auVar16);
    uVar1 = auVar7._8_8_;
    local_30 = auVar7._0_8_;
  }
  else {
    iVar4 = in_RDI[2];
    dVar5 = log((double)in_RDI[2]);
    dVar6 = log((double)iVar2);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (double)iVar4;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_30;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar5 - dVar6;
    auVar7 = vfmadd213sd_fma(auVar8,auVar13,auVar17);
    uVar1 = auVar7._8_8_;
    local_30 = auVar7._0_8_;
  }
  auVar14._0_8_ = (double)(local_34 * (1 << (((char)local_38 - (char)local_28) + 1U & 0x1f)));
  auVar14._8_8_ = uVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_30;
  auVar7 = vfmadd213sd_fma(auVar9,auVar14,ZEXT816(0x3fe0000000000000));
  return (int)auVar7._0_8_;
}

Assistant:

int DetectorSS::Estimate(int bucket, unsigned char* bmp) {
	int offs = bucket * ss_.offsets[ss_.c];
	int z, tmpoff = 0, base;
	double m;
	int factor = 1;
	for (base = 0; base < ss_.c - 1; base++) {
		tmpoff = offs + ss_.offsets[base];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		//TL: if the bitmap is not full
		if (ss_.b - z <= ss_.setmax) {
			break;
		}
		else {
			factor = factor * 2;
		}
	}
	m = 0;

	int pos = base - 1;
	for (int i = base; i < ss_.c - 1; i++) {
		tmpoff = offs + ss_.offsets[i];
		z = countzerobits(bmp, tmpoff, tmpoff + ss_.b);
		m += ss_.b * (log(ss_.b) - log(z));
		if (z == 0 || ss_.b - z > ss_.setmax) {
			pos = i;
			m = 0;
		}
	}
	factor = factor * (1 << (pos - base + 1));

	tmpoff = offs + ss_.offsets[ss_.c - 1];
	z = countzerobits(bmp, tmpoff, tmpoff + ss_.lastb);
	if (z == 0) {
		m += ss_.lastb * (log(ss_.lastb));
	}
	else {
		m += ss_.lastb * (log(ss_.lastb) - log(z));
	}
	return (int)(factor * m + 0.5);
}